

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *type)

{
  uint uVar1;
  undefined2 *puVar2;
  uint64_t id;
  Which expectedKind;
  int iVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  bool bVar6;
  undefined8 local_88;
  undefined8 uStack_80;
  PointerReader local_78;
  StructReader local_50;
  
  uVar1 = (type->_reader).dataSize;
  if (uVar1 < 0x10) {
    return;
  }
  puVar2 = (undefined2 *)(type->_reader).data;
  switch(*puVar2) {
  case 0xe:
    bVar6 = (type->_reader).pointerCount == 0;
    local_78.pointer = (type->_reader).pointers;
    if (bVar6) {
      local_78.pointer = (WirePointer *)0x0;
    }
    local_78.nestingLimit = 0x7fffffff;
    if (!bVar6) {
      local_78.nestingLimit = (type->_reader).nestingLimit;
    }
    local_78.segment._0_4_ = 0;
    local_78.segment._4_4_ = 0;
    local_78.capTable._0_4_ = 0;
    local_78.capTable._4_4_ = 0;
    if (!bVar6) {
      local_78.segment._0_4_ = *(undefined4 *)&(type->_reader).segment;
      local_78.segment._4_4_ = *(undefined4 *)((long)&(type->_reader).segment + 4);
      local_78.capTable._0_4_ = *(undefined4 *)&(type->_reader).capTable;
      local_78.capTable._4_4_ = *(undefined4 *)((long)&(type->_reader).capTable + 4);
    }
    capnp::_::PointerReader::getStruct(&local_50,&local_78,(word *)0x0);
    validate(this,(Reader *)&local_50);
    return;
  case 0xf:
    pWVar4 = (type->_reader).pointers;
    SVar5 = (type->_reader).pointerCount;
    iVar3 = (type->_reader).nestingLimit;
    if (uVar1 < 0x80) {
      id = 0;
    }
    else {
      id = *(uint64_t *)(puVar2 + 4);
    }
    local_88 = (type->_reader).segment;
    uStack_80 = (type->_reader).capTable;
    expectedKind = ENUM;
    break;
  case 0x10:
    pWVar4 = (type->_reader).pointers;
    SVar5 = (type->_reader).pointerCount;
    iVar3 = (type->_reader).nestingLimit;
    if (uVar1 < 0x80) {
      id = 0;
    }
    else {
      id = *(uint64_t *)(puVar2 + 4);
    }
    local_88 = (type->_reader).segment;
    uStack_80 = (type->_reader).capTable;
    expectedKind = STRUCT;
    break;
  case 0x11:
    pWVar4 = (type->_reader).pointers;
    SVar5 = (type->_reader).pointerCount;
    iVar3 = (type->_reader).nestingLimit;
    if (uVar1 < 0x80) {
      id = 0;
    }
    else {
      id = *(uint64_t *)(puVar2 + 4);
    }
    local_88 = (type->_reader).segment;
    uStack_80 = (type->_reader).capTable;
    expectedKind = INTERFACE;
    break;
  default:
    goto switchD_001ad35c_default;
  }
  validateTypeId(this,id,expectedKind);
  local_78.segment._0_4_ = 0;
  local_78.segment._4_4_ = 0;
  local_78.capTable._0_4_ = 0;
  local_78.capTable._4_4_ = 0;
  local_78.pointer = pWVar4;
  if (SVar5 == 0) {
    local_78.pointer = (WirePointer *)0x0;
  }
  local_78.nestingLimit = 0x7fffffff;
  if (SVar5 != 0) {
    local_78.segment._0_4_ = (undefined4)local_88;
    local_78.segment._4_4_ = local_88._4_4_;
    local_78.capTable._0_4_ = (undefined4)uStack_80;
    local_78.capTable._4_4_ = uStack_80._4_4_;
    local_78.nestingLimit = iVar3;
  }
  capnp::_::PointerReader::getStruct(&local_50,&local_78,(word *)0x0);
  validate(this,(Reader *)&local_50);
switchD_001ad35c_default:
  return;
}

Assistant:

inline T StructReader::getDataField(StructDataOffset offset) const {
  if ((offset + ONE * ELEMENTS) * capnp::bitsPerElement<T>() <= dataSize) {
    return reinterpret_cast<const WireValue<T>*>(data)[unbound(offset / ELEMENTS)].get();
  } else {
    return static_cast<T>(0);
  }
}